

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstantExecution.h
# Opt level: O2

void nrg::InstantExecution::
     push<void(*)(std::ostream&,std::__cxx11::string_const&),std::reference_wrapper<std::ostream>,std::__cxx11::string>
               (Queue *queue,
               _func_void_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
               *fn,reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_> *param,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *param_4)

{
  QueueElement elem;
  function<void_()> local_80;
  function<void_()> local_60;
  undefined1 local_40 [48];
  
  local_40._8_8_ = param->_M_data;
  local_40._0_8_ = fn;
  std::__cxx11::string::string((string *)(local_40 + 0x10),(string *)param_4);
  std::function<void()>::
  function<nrg::InstantExecution::push<void(*)(std::ostream&,std::__cxx11::string_const&),std::reference_wrapper<std::ostream>,std::__cxx11::string>(std::queue<std::function<void()>,std::deque<std::function<void()>,std::allocator<std::function<void()>>>>&,void(*)(std::ostream&,std::__cxx11::string_const&),std::reference_wrapper<std::ostream>&&,std::__cxx11::string&&)::_lambda()_1_,void>
            ((function<void()> *)&local_60,(anon_class_48_3_7e084ec6 *)local_40);
  std::__cxx11::string::~string((string *)(local_40 + 0x10));
  std::function<void_()>::function(&local_80,&local_60);
  std::deque<std::function<void()>,std::allocator<std::function<void()>>>::
  emplace_back<std::function<void()>>
            ((deque<std::function<void()>,std::allocator<std::function<void()>>> *)queue,&local_80);
  std::_Function_base::~_Function_base(&local_80.super__Function_base);
  std::_Function_base::~_Function_base(&local_60.super__Function_base);
  return;
}

Assistant:

static void push(Queue& queue, FN fn, Param&&... param)
    {
        QueueElement elem = [=]() { fn(param...); };
        push(queue, elem);
    }